

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int iVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  undefined1 (*pauVar34) [16];
  long lVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  undefined4 uVar43;
  ulong unaff_R14;
  undefined1 auVar44 [64];
  float fVar45;
  float fVar54;
  float fVar55;
  undefined1 auVar46 [16];
  float fVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar51 [32];
  undefined1 auVar47 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  float fVar65;
  undefined1 auVar64 [16];
  undefined1 auVar63 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  float fVar76;
  vfloat4 a0;
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar86;
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [32];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar105;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar117 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [32];
  float fVar127;
  undefined1 auVar126 [64];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar131 [32];
  vfloat<8> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2620 [8];
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  float local_24e0 [4];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  undefined1 local_2480 [8];
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined1 local_2460 [8];
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar91 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar47 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar46 = vrsqrtss_avx(auVar47,auVar47);
    fVar76 = auVar46._0_4_;
    local_24e0[0] = fVar76 * 1.5 - auVar47._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
    auVar66 = vshufps_avx(ZEXT416((uint)local_24e0[0]),ZEXT416((uint)local_24e0[0]),0);
    auVar77._0_4_ = aVar3.x * auVar66._0_4_;
    auVar77._4_4_ = aVar3.y * auVar66._4_4_;
    auVar77._8_4_ = aVar3.z * auVar66._8_4_;
    auVar77._12_4_ = aVar3.field_3.w * auVar66._12_4_;
    auVar46 = vshufpd_avx(auVar77,auVar77,1);
    auVar47 = vmovshdup_avx(auVar77);
    auVar101._8_4_ = 0x80000000;
    auVar101._0_8_ = 0x8000000080000000;
    auVar101._12_4_ = 0x80000000;
    auVar87._12_4_ = 0;
    auVar87._0_12_ = ZEXT812(0);
    auVar87 = auVar87 << 0x20;
    auVar64 = vunpckhps_avx(auVar77,auVar87);
    auVar93 = vshufps_avx(auVar64,ZEXT416(auVar47._0_4_ ^ 0x80000000),0x41);
    auVar64._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
    auVar64._8_8_ = auVar101._8_8_ ^ auVar46._8_8_;
    auVar64 = vinsertps_avx(auVar64,auVar77,0x2a);
    auVar47 = vdpps_avx(auVar93,auVar93,0x7f);
    auVar46 = vdpps_avx(auVar64,auVar64,0x7f);
    auVar47 = vcmpps_avx(auVar46,auVar47,1);
    auVar47 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = vblendvps_avx(auVar64,auVar93,auVar47);
    auVar46 = vdpps_avx(auVar47,auVar47,0x7f);
    auVar64 = vrsqrtss_avx(auVar46,auVar46);
    fVar76 = auVar64._0_4_;
    auVar46 = ZEXT416((uint)(fVar76 * 1.5 - auVar46._0_4_ * 0.5 * fVar76 * fVar76 * fVar76));
    auVar46 = vshufps_avx(auVar46,auVar46,0);
    auVar93._0_4_ = auVar47._0_4_ * auVar46._0_4_;
    auVar93._4_4_ = auVar47._4_4_ * auVar46._4_4_;
    auVar93._8_4_ = auVar47._8_4_ * auVar46._8_4_;
    auVar93._12_4_ = auVar47._12_4_ * auVar46._12_4_;
    auVar47 = vshufps_avx(auVar93,auVar93,0xc9);
    auVar46 = vshufps_avx(auVar77,auVar77,0xc9);
    auVar102._0_4_ = auVar46._0_4_ * auVar93._0_4_;
    auVar102._4_4_ = auVar46._4_4_ * auVar93._4_4_;
    auVar102._8_4_ = auVar46._8_4_ * auVar93._8_4_;
    auVar102._12_4_ = auVar46._12_4_ * auVar93._12_4_;
    auVar98._0_4_ = auVar77._0_4_ * auVar47._0_4_;
    auVar98._4_4_ = auVar77._4_4_ * auVar47._4_4_;
    auVar98._8_4_ = auVar77._8_4_ * auVar47._8_4_;
    auVar98._12_4_ = auVar77._12_4_ * auVar47._12_4_;
    auVar47 = vsubps_avx(auVar98,auVar102);
    auVar64 = vshufps_avx(auVar47,auVar47,0xc9);
    auVar47 = vdpps_avx(auVar64,auVar64,0x7f);
    auVar46 = vrsqrtss_avx(auVar47,auVar47);
    fVar76 = auVar46._0_4_;
    auVar47 = ZEXT416((uint)(fVar76 * 1.5 - fVar76 * fVar76 * fVar76 * auVar47._0_4_ * 0.5));
    auVar47 = vshufps_avx(auVar47,auVar47,0);
    auVar46._0_4_ = auVar47._0_4_ * auVar64._0_4_;
    auVar46._4_4_ = auVar47._4_4_ * auVar64._4_4_;
    auVar46._8_4_ = auVar47._8_4_ * auVar64._8_4_;
    auVar46._12_4_ = auVar47._12_4_ * auVar64._12_4_;
    auVar47._0_4_ = auVar66._0_4_ * auVar77._0_4_;
    auVar47._4_4_ = auVar66._4_4_ * auVar77._4_4_;
    auVar47._8_4_ = auVar66._8_4_ * auVar77._8_4_;
    auVar47._12_4_ = auVar66._12_4_ * auVar77._12_4_;
    auVar64 = vunpcklps_avx(auVar93,auVar47);
    auVar47 = vunpckhps_avx(auVar93,auVar47);
    auVar66 = vunpcklps_avx(auVar46,auVar87);
    auVar46 = vunpckhps_avx(auVar46,auVar87);
    local_24b0 = vunpcklps_avx(auVar47,auVar46);
    local_24d0 = vunpcklps_avx(auVar64,auVar66);
    local_24c0 = vunpckhps_avx(auVar64,auVar66);
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      pauVar40 = (undefined1 (*) [16])local_2390;
      auVar97 = ZEXT864(0) << 0x20;
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar64 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar66._8_4_ = 0x7fffffff;
      auVar66._0_8_ = 0x7fffffff7fffffff;
      auVar66._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx((undefined1  [16])aVar3,auVar66);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar78,1);
      auVar47 = vblendvps_avx((undefined1  [16])aVar3,auVar78,auVar47);
      auVar66 = vrcpps_avx(auVar47);
      fVar76 = auVar66._0_4_;
      auVar67._0_4_ = auVar47._0_4_ * fVar76;
      fVar9 = auVar66._4_4_;
      auVar67._4_4_ = auVar47._4_4_ * fVar9;
      fVar10 = auVar66._8_4_;
      auVar67._8_4_ = auVar47._8_4_ * fVar10;
      fVar105 = auVar66._12_4_;
      auVar67._12_4_ = auVar47._12_4_ * fVar105;
      auVar88._8_4_ = 0x3f800000;
      auVar88._0_8_ = &DAT_3f8000003f800000;
      auVar88._12_4_ = 0x3f800000;
      auVar91 = ZEXT1664(auVar88);
      auVar47 = vsubps_avx(auVar88,auVar67);
      auVar68._0_4_ = fVar76 + fVar76 * auVar47._0_4_;
      auVar68._4_4_ = fVar9 + fVar9 * auVar47._4_4_;
      auVar68._8_4_ = fVar10 + fVar10 * auVar47._8_4_;
      auVar68._12_4_ = fVar105 + fVar105 * auVar47._12_4_;
      fVar76 = (ray->super_RayK<1>).org.field_0.m128[0];
      auVar99._4_4_ = fVar76;
      auVar99._0_4_ = fVar76;
      auVar99._8_4_ = fVar76;
      auVar99._12_4_ = fVar76;
      auVar99._16_4_ = fVar76;
      auVar99._20_4_ = fVar76;
      auVar99._24_4_ = fVar76;
      auVar99._28_4_ = fVar76;
      fVar9 = (ray->super_RayK<1>).org.field_0.m128[1];
      auVar103._4_4_ = fVar9;
      auVar103._0_4_ = fVar9;
      auVar103._8_4_ = fVar9;
      auVar103._12_4_ = fVar9;
      auVar103._16_4_ = fVar9;
      auVar103._20_4_ = fVar9;
      auVar103._24_4_ = fVar9;
      auVar103._28_4_ = fVar9;
      fVar10 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar106._4_4_ = fVar10;
      auVar106._0_4_ = fVar10;
      auVar106._8_4_ = fVar10;
      auVar106._12_4_ = fVar10;
      auVar106._16_4_ = fVar10;
      auVar106._20_4_ = fVar10;
      auVar106._24_4_ = fVar10;
      auVar106._28_4_ = fVar10;
      auVar47 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0);
      register0x00001310 = auVar47;
      _local_2460 = auVar47;
      auVar47 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x55);
      register0x00001310 = auVar47;
      _local_2480 = auVar47;
      auVar47 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0xaa);
      register0x00001210 = auVar47;
      _local_24a0 = auVar47;
      auVar47 = vshufps_avx(auVar68,auVar68,0);
      local_2500._16_16_ = auVar47;
      local_2500._0_16_ = auVar47;
      auVar117 = ZEXT3264(local_2500);
      auVar47 = vmovshdup_avx(auVar68);
      auVar66 = vshufps_avx(auVar68,auVar68,0x55);
      local_2520._16_16_ = auVar66;
      local_2520._0_16_ = auVar66;
      auVar124 = ZEXT3264(local_2520);
      auVar66 = vshufpd_avx(auVar68,auVar68,1);
      auVar85 = ZEXT1664(auVar66);
      auVar93 = vshufps_avx(auVar68,auVar68,0xaa);
      auVar75 = ZEXT1664(auVar93);
      local_2540._16_16_ = auVar93;
      local_2540._0_16_ = auVar93;
      auVar126 = ZEXT3264(local_2540);
      uVar37 = (ulong)(auVar68._0_4_ < 0.0) * 0x20;
      uVar39 = (ulong)(auVar47._0_4_ < 0.0) << 5 | 0x40;
      uVar42 = (ulong)(auVar66._0_4_ < 0.0) << 5 | 0x80;
      auVar47 = vshufps_avx(auVar46,auVar46,0);
      local_2560._16_16_ = auVar47;
      local_2560._0_16_ = auVar47;
      auVar129 = ZEXT3264(local_2560);
      auVar47 = vshufps_avx(auVar64,auVar64,0);
      auVar44 = ZEXT3264(CONCAT1616(auVar47,auVar47));
      do {
        do {
          if (pauVar40 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar41 = pauVar40 + -1;
          auVar63 = ZEXT464((uint)*(float *)(*pauVar41 + 8));
          pauVar40 = pauVar40 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar41 + 8));
        uVar31 = *(ulong *)*pauVar40;
        do {
          if ((uVar31 & 8) == 0) {
            fVar105 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar33 = (uint)uVar31 & 7;
            uVar30 = uVar31 & 0xfffffffffffffff0;
            if (uVar33 == 3) {
              local_2400 = *(float *)(uVar30 + 0x40);
              fStack_23fc = *(float *)(uVar30 + 0x44);
              fStack_23f8 = *(float *)(uVar30 + 0x48);
              fStack_23f4 = *(float *)(uVar30 + 0x4c);
              fStack_23f0 = *(float *)(uVar30 + 0x50);
              fStack_23ec = *(float *)(uVar30 + 0x54);
              fStack_23e8 = *(float *)(uVar30 + 0x58);
              uStack_23e4 = *(undefined4 *)(uVar30 + 0x5c);
              local_2420 = *(float *)(uVar30 + 0xe0);
              fStack_241c = *(float *)(uVar30 + 0xe4);
              fStack_2418 = *(float *)(uVar30 + 0xe8);
              fStack_2414 = *(float *)(uVar30 + 0xec);
              fStack_2410 = *(float *)(uVar30 + 0xf0);
              fStack_240c = *(float *)(uVar30 + 0xf4);
              fStack_2408 = *(float *)(uVar30 + 0xf8);
              uStack_2404 = *(undefined4 *)(uVar30 + 0xfc);
              auVar47 = vshufps_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),0);
              fVar111 = auVar47._0_4_;
              fVar55 = auVar47._4_4_;
              fVar112 = auVar47._8_4_;
              fVar56 = auVar47._12_4_;
              fVar105 = 1.0 - fVar105;
              auVar47 = vshufps_avx(ZEXT416((uint)(fVar105 * 0.0)),ZEXT416((uint)(fVar105 * 0.0)),0)
              ;
              fStack_23d0 = auVar47._0_4_;
              fStack_23cc = auVar47._4_4_;
              fStack_23c8 = auVar47._8_4_;
              fVar127 = auVar47._12_4_;
              local_2620._4_4_ = fStack_23cc + fVar55 * *(float *)(uVar30 + 0x1c4);
              local_2620._0_4_ = fStack_23d0 + fVar111 * *(float *)(uVar30 + 0x1c0);
              fStack_2618 = fStack_23c8 + fVar112 * *(float *)(uVar30 + 0x1c8);
              fStack_2614 = fVar127 + fVar56 * *(float *)(uVar30 + 0x1cc);
              fStack_2610 = fStack_23d0 + fVar111 * *(float *)(uVar30 + 0x1d0);
              fStack_260c = fStack_23cc + fVar55 * *(float *)(uVar30 + 0x1d4);
              fStack_2608 = fStack_23c8 + fVar112 * *(float *)(uVar30 + 0x1d8);
              fStack_2604 = fVar127 + 0.0;
              local_23c0 = fStack_23d0 + fVar111 * *(float *)(uVar30 + 0x1e0);
              fStack_23bc = fStack_23cc + fVar55 * *(float *)(uVar30 + 0x1e4);
              fStack_23b8 = fStack_23c8 + fVar112 * *(float *)(uVar30 + 0x1e8);
              fStack_23b4 = fVar127 + fVar56 * *(float *)(uVar30 + 0x1ec);
              fStack_23b0 = fStack_23d0 + fVar111 * *(float *)(uVar30 + 0x1f0);
              fStack_23ac = fStack_23cc + fVar55 * *(float *)(uVar30 + 500);
              fStack_23a8 = fStack_23c8 + fVar112 * *(float *)(uVar30 + 0x1f8);
              fStack_23a4 = fVar127 + fVar10;
              local_23e0 = fStack_23d0 + fVar111 * *(float *)(uVar30 + 0x200);
              fStack_23dc = fStack_23cc + fVar55 * *(float *)(uVar30 + 0x204);
              fStack_23d8 = fStack_23c8 + fVar112 * *(float *)(uVar30 + 0x208);
              fStack_23d4 = fVar127 + fVar56 * *(float *)(uVar30 + 0x20c);
              fStack_23d0 = fStack_23d0 + fVar111 * *(float *)(uVar30 + 0x210);
              fStack_23cc = fStack_23cc + fVar55 * *(float *)(uVar30 + 0x214);
              fStack_23c8 = fStack_23c8 + fVar112 * *(float *)(uVar30 + 0x218);
              fVar6 = auVar124._28_4_;
              fStack_23c4 = fVar127 + fVar6;
              auVar72._0_4_ =
                   (float)local_2460._0_4_ * local_2400 +
                   (float)local_2480._0_4_ * *(float *)(uVar30 + 0xa0) +
                   *(float *)(uVar30 + 0x100) * (float)local_24a0._0_4_;
              auVar72._4_4_ =
                   (float)local_2460._4_4_ * fStack_23fc +
                   (float)local_2480._4_4_ * *(float *)(uVar30 + 0xa4) +
                   *(float *)(uVar30 + 0x104) * (float)local_24a0._4_4_;
              auVar72._8_4_ =
                   fStack_2458 * fStack_23f8 +
                   fStack_2478 * *(float *)(uVar30 + 0xa8) +
                   *(float *)(uVar30 + 0x108) * fStack_2498;
              auVar72._12_4_ =
                   fStack_2454 * fStack_23f4 +
                   fStack_2474 * *(float *)(uVar30 + 0xac) +
                   *(float *)(uVar30 + 0x10c) * fStack_2494;
              auVar72._16_4_ =
                   fStack_2450 * fStack_23f0 +
                   fStack_2470 * *(float *)(uVar30 + 0xb0) +
                   *(float *)(uVar30 + 0x110) * fStack_2490;
              auVar72._20_4_ =
                   fStack_244c * fStack_23ec +
                   fStack_246c * *(float *)(uVar30 + 0xb4) +
                   *(float *)(uVar30 + 0x114) * fStack_248c;
              auVar72._24_4_ =
                   fStack_2448 * fStack_23e8 +
                   fStack_2468 * *(float *)(uVar30 + 0xb8) +
                   *(float *)(uVar30 + 0x118) * fStack_2488;
              auVar72._28_4_ = fVar6 + in_ZMM14._28_4_ + 0.0;
              auVar130._0_4_ =
                   *(float *)(uVar30 + 0x60) * (float)local_2460._0_4_ +
                   *(float *)(uVar30 + 0xc0) * (float)local_2480._0_4_ +
                   (float)local_24a0._0_4_ * *(float *)(uVar30 + 0x120);
              auVar130._4_4_ =
                   *(float *)(uVar30 + 100) * (float)local_2460._4_4_ +
                   *(float *)(uVar30 + 0xc4) * (float)local_2480._4_4_ +
                   (float)local_24a0._4_4_ * *(float *)(uVar30 + 0x124);
              auVar130._8_4_ =
                   *(float *)(uVar30 + 0x68) * fStack_2458 +
                   *(float *)(uVar30 + 200) * fStack_2478 + fStack_2498 * *(float *)(uVar30 + 0x128)
              ;
              auVar130._12_4_ =
                   *(float *)(uVar30 + 0x6c) * fStack_2454 +
                   *(float *)(uVar30 + 0xcc) * fStack_2474 + fStack_2494 * *(float *)(uVar30 + 300);
              auVar130._16_4_ =
                   *(float *)(uVar30 + 0x70) * fStack_2450 +
                   *(float *)(uVar30 + 0xd0) * fStack_2470 +
                   fStack_2490 * *(float *)(uVar30 + 0x130);
              auVar130._20_4_ =
                   *(float *)(uVar30 + 0x74) * fStack_244c +
                   *(float *)(uVar30 + 0xd4) * fStack_246c +
                   fStack_248c * *(float *)(uVar30 + 0x134);
              auVar130._24_4_ =
                   *(float *)(uVar30 + 0x78) * fStack_2448 +
                   *(float *)(uVar30 + 0xd8) * fStack_2468 +
                   fStack_2488 * *(float *)(uVar30 + 0x138);
              auVar130._28_4_ = fVar127 + in_ZMM14._28_4_ + fVar6;
              auVar107._0_4_ =
                   *(float *)(uVar30 + 0x80) * (float)local_2460._0_4_ +
                   local_2420 * (float)local_2480._0_4_ +
                   (float)local_24a0._0_4_ * *(float *)(uVar30 + 0x140);
              auVar107._4_4_ =
                   *(float *)(uVar30 + 0x84) * (float)local_2460._4_4_ +
                   fStack_241c * (float)local_2480._4_4_ +
                   (float)local_24a0._4_4_ * *(float *)(uVar30 + 0x144);
              auVar107._8_4_ =
                   *(float *)(uVar30 + 0x88) * fStack_2458 +
                   fStack_2418 * fStack_2478 + fStack_2498 * *(float *)(uVar30 + 0x148);
              auVar107._12_4_ =
                   *(float *)(uVar30 + 0x8c) * fStack_2454 +
                   fStack_2414 * fStack_2474 + fStack_2494 * *(float *)(uVar30 + 0x14c);
              auVar107._16_4_ =
                   *(float *)(uVar30 + 0x90) * fStack_2450 +
                   fStack_2410 * fStack_2470 + fStack_2490 * *(float *)(uVar30 + 0x150);
              auVar107._20_4_ =
                   *(float *)(uVar30 + 0x94) * fStack_244c +
                   fStack_240c * fStack_246c + fStack_248c * *(float *)(uVar30 + 0x154);
              auVar107._24_4_ =
                   *(float *)(uVar30 + 0x98) * fStack_2448 +
                   fStack_2408 * fStack_2468 + fStack_2488 * *(float *)(uVar30 + 0x158);
              auVar107._28_4_ = fVar10 + fVar6 + fVar127;
              auVar52._8_4_ = 0x7fffffff;
              auVar52._0_8_ = 0x7fffffff7fffffff;
              auVar52._12_4_ = 0x7fffffff;
              auVar52._16_4_ = 0x7fffffff;
              auVar52._20_4_ = 0x7fffffff;
              auVar52._24_4_ = 0x7fffffff;
              auVar52._28_4_ = 0x7fffffff;
              auVar109 = vandps_avx(auVar72,auVar52);
              auVar83._8_4_ = 0x219392ef;
              auVar83._0_8_ = 0x219392ef219392ef;
              auVar83._12_4_ = 0x219392ef;
              auVar83._16_4_ = 0x219392ef;
              auVar83._20_4_ = 0x219392ef;
              auVar83._24_4_ = 0x219392ef;
              auVar83._28_4_ = 0x219392ef;
              auVar109 = vcmpps_avx(auVar109,auVar83,1);
              auVar53 = vblendvps_avx(auVar72,auVar83,auVar109);
              auVar109 = vandps_avx(auVar130,auVar52);
              auVar109 = vcmpps_avx(auVar109,auVar83,1);
              auVar8 = vblendvps_avx(auVar130,auVar83,auVar109);
              auVar109 = vandps_avx(auVar107,auVar52);
              auVar52 = vcmpps_avx(auVar109,auVar83,1);
              auVar109 = vblendvps_avx(auVar107,auVar83,auVar52);
              auVar47 = vshufps_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),0);
              fVar105 = auVar47._0_4_;
              auVar128._0_4_ = fVar111 * *(float *)(uVar30 + 0x220) + fVar105;
              fVar45 = auVar47._4_4_;
              auVar128._4_4_ = fVar55 * *(float *)(uVar30 + 0x224) + fVar45;
              fVar110 = auVar47._8_4_;
              auVar128._8_4_ = fVar112 * *(float *)(uVar30 + 0x228) + fVar110;
              fVar54 = auVar47._12_4_;
              auVar128._12_4_ = fVar56 * *(float *)(uVar30 + 0x22c) + fVar54;
              auVar128._16_4_ = fVar111 * *(float *)(uVar30 + 0x230) + fVar105;
              auVar128._20_4_ = fVar55 * *(float *)(uVar30 + 0x234) + fVar45;
              auVar128._24_4_ = fVar112 * *(float *)(uVar30 + 0x238) + fVar110;
              auVar128._28_4_ = auVar107._28_4_ + fVar54;
              local_2440 = fVar111 * *(float *)(uVar30 + 0x240) + fVar105;
              fStack_243c = fVar55 * *(float *)(uVar30 + 0x244) + fVar45;
              fStack_2438 = fVar112 * *(float *)(uVar30 + 0x248) + fVar110;
              fStack_2434 = fVar56 * *(float *)(uVar30 + 0x24c) + fVar54;
              fStack_2430 = fVar111 * *(float *)(uVar30 + 0x250) + fVar105;
              fStack_242c = fVar55 * *(float *)(uVar30 + 0x254) + fVar45;
              fStack_2428 = fVar112 * *(float *)(uVar30 + 600) + fVar110;
              fStack_2424 = auVar52._28_4_ + fVar54;
              auVar131._0_4_ = fVar105 + fVar111 * *(float *)(uVar30 + 0x260);
              auVar131._4_4_ = fVar45 + fVar55 * *(float *)(uVar30 + 0x264);
              auVar131._8_4_ = fVar110 + fVar112 * *(float *)(uVar30 + 0x268);
              auVar131._12_4_ = fVar54 + fVar56 * *(float *)(uVar30 + 0x26c);
              auVar131._16_4_ = fVar105 + fVar111 * *(float *)(uVar30 + 0x270);
              auVar131._20_4_ = fVar45 + fVar55 * *(float *)(uVar30 + 0x274);
              auVar131._24_4_ = fVar110 + fVar112 * *(float *)(uVar30 + 0x278);
              auVar131._28_4_ = fVar54 + NAN;
              auVar52 = vrcpps_avx(auVar53);
              fVar105 = auVar52._0_4_;
              fVar110 = auVar52._4_4_;
              auVar11._4_4_ = auVar53._4_4_ * fVar110;
              auVar11._0_4_ = auVar53._0_4_ * fVar105;
              fVar111 = auVar52._8_4_;
              auVar11._8_4_ = auVar53._8_4_ * fVar111;
              fVar112 = auVar52._12_4_;
              auVar11._12_4_ = auVar53._12_4_ * fVar112;
              fVar113 = auVar52._16_4_;
              auVar11._16_4_ = auVar53._16_4_ * fVar113;
              fVar114 = auVar52._20_4_;
              auVar11._20_4_ = auVar53._20_4_ * fVar114;
              fVar115 = auVar52._24_4_;
              auVar11._24_4_ = auVar53._24_4_ * fVar115;
              auVar11._28_4_ = fVar54;
              auVar73._8_4_ = 0x3f800000;
              auVar73._0_8_ = &DAT_3f8000003f800000;
              auVar73._12_4_ = 0x3f800000;
              auVar73._16_4_ = 0x3f800000;
              auVar73._20_4_ = 0x3f800000;
              auVar73._24_4_ = 0x3f800000;
              auVar73._28_4_ = 0x3f800000;
              auVar52 = vsubps_avx(auVar73,auVar11);
              fVar105 = fVar105 + fVar105 * auVar52._0_4_;
              fVar110 = fVar110 + fVar110 * auVar52._4_4_;
              fVar111 = fVar111 + fVar111 * auVar52._8_4_;
              fVar112 = fVar112 + fVar112 * auVar52._12_4_;
              fVar113 = fVar113 + fVar113 * auVar52._16_4_;
              fVar114 = fVar114 + fVar114 * auVar52._20_4_;
              fVar115 = fVar115 + fVar115 * auVar52._24_4_;
              auVar53 = vrcpps_avx(auVar8);
              fVar45 = auVar53._0_4_;
              fVar54 = auVar53._4_4_;
              auVar17._4_4_ = auVar8._4_4_ * fVar54;
              auVar17._0_4_ = auVar8._0_4_ * fVar45;
              fVar55 = auVar53._8_4_;
              auVar17._8_4_ = auVar8._8_4_ * fVar55;
              fVar56 = auVar53._12_4_;
              auVar17._12_4_ = auVar8._12_4_ * fVar56;
              fVar57 = auVar53._16_4_;
              auVar17._16_4_ = auVar8._16_4_ * fVar57;
              fVar58 = auVar53._20_4_;
              auVar17._20_4_ = auVar8._20_4_ * fVar58;
              fVar59 = auVar53._24_4_;
              auVar17._24_4_ = auVar8._24_4_ * fVar59;
              auVar17._28_4_ = auVar52._28_4_;
              auVar52 = vsubps_avx(auVar73,auVar17);
              auVar8 = vrcpps_avx(auVar109);
              fVar45 = fVar45 + fVar45 * auVar52._0_4_;
              fVar54 = fVar54 + fVar54 * auVar52._4_4_;
              fVar55 = fVar55 + fVar55 * auVar52._8_4_;
              fVar56 = fVar56 + fVar56 * auVar52._12_4_;
              fVar57 = fVar57 + fVar57 * auVar52._16_4_;
              fVar58 = fVar58 + fVar58 * auVar52._20_4_;
              fVar59 = fVar59 + fVar59 * auVar52._24_4_;
              fVar116 = auVar8._0_4_;
              fVar118 = auVar8._4_4_;
              auVar18._4_4_ = fVar118 * auVar109._4_4_;
              auVar18._0_4_ = fVar116 * auVar109._0_4_;
              fVar119 = auVar8._8_4_;
              auVar18._8_4_ = fVar119 * auVar109._8_4_;
              fVar120 = auVar8._12_4_;
              auVar18._12_4_ = fVar120 * auVar109._12_4_;
              fVar121 = auVar8._16_4_;
              auVar18._16_4_ = fVar121 * auVar109._16_4_;
              fVar122 = auVar8._20_4_;
              auVar18._20_4_ = fVar122 * auVar109._20_4_;
              fVar123 = auVar8._24_4_;
              auVar18._24_4_ = fVar123 * auVar109._24_4_;
              auVar18._28_4_ = auVar52._28_4_;
              auVar8 = vsubps_avx(auVar73,auVar18);
              fVar86 = auVar109._28_4_ + *(float *)(uVar30 + 0x17c);
              fVar116 = fVar116 + fVar116 * auVar8._0_4_;
              fVar118 = fVar118 + fVar118 * auVar8._4_4_;
              fVar119 = fVar119 + fVar119 * auVar8._8_4_;
              fVar120 = fVar120 + fVar120 * auVar8._12_4_;
              fVar121 = fVar121 + fVar121 * auVar8._16_4_;
              fVar122 = fVar122 + fVar122 * auVar8._20_4_;
              fVar123 = fVar123 + fVar123 * auVar8._24_4_;
              fVar65 = auVar8._28_4_ + fVar86;
              fVar92 = *(float *)(uVar30 + 0x13c) +
                       *(float *)(uVar30 + 0xbc) + *(float *)(uVar30 + 0x1bc);
              auVar96._0_4_ =
                   local_2400 * fVar76 +
                   *(float *)(uVar30 + 0xa0) * fVar9 +
                   *(float *)(uVar30 + 0x100) * fVar10 + *(float *)(uVar30 + 0x160);
              auVar96._4_4_ =
                   fStack_23fc * fVar76 +
                   *(float *)(uVar30 + 0xa4) * fVar9 +
                   *(float *)(uVar30 + 0x104) * fVar10 + *(float *)(uVar30 + 0x164);
              auVar96._8_4_ =
                   fStack_23f8 * fVar76 +
                   *(float *)(uVar30 + 0xa8) * fVar9 +
                   *(float *)(uVar30 + 0x108) * fVar10 + *(float *)(uVar30 + 0x168);
              auVar96._12_4_ =
                   fStack_23f4 * fVar76 +
                   *(float *)(uVar30 + 0xac) * fVar9 +
                   *(float *)(uVar30 + 0x10c) * fVar10 + *(float *)(uVar30 + 0x16c);
              auVar96._16_4_ =
                   fStack_23f0 * fVar76 +
                   *(float *)(uVar30 + 0xb0) * fVar9 +
                   *(float *)(uVar30 + 0x110) * fVar10 + *(float *)(uVar30 + 0x170);
              auVar96._20_4_ =
                   fStack_23ec * fVar76 +
                   *(float *)(uVar30 + 0xb4) * fVar9 +
                   *(float *)(uVar30 + 0x114) * fVar10 + *(float *)(uVar30 + 0x174);
              auVar96._24_4_ =
                   fStack_23e8 * fVar76 +
                   *(float *)(uVar30 + 0xb8) * fVar9 +
                   *(float *)(uVar30 + 0x118) * fVar10 + *(float *)(uVar30 + 0x178);
              auVar96._28_4_ = *(float *)(uVar30 + 0x13c) + fVar65;
              auVar100._0_4_ =
                   *(float *)(uVar30 + 0x60) * fVar76 +
                   *(float *)(uVar30 + 0xc0) * fVar9 +
                   *(float *)(uVar30 + 0x120) * fVar10 + *(float *)(uVar30 + 0x180);
              auVar100._4_4_ =
                   *(float *)(uVar30 + 100) * fVar76 +
                   *(float *)(uVar30 + 0xc4) * fVar9 +
                   *(float *)(uVar30 + 0x124) * fVar10 + *(float *)(uVar30 + 0x184);
              auVar100._8_4_ =
                   *(float *)(uVar30 + 0x68) * fVar76 +
                   *(float *)(uVar30 + 200) * fVar9 +
                   *(float *)(uVar30 + 0x128) * fVar10 + *(float *)(uVar30 + 0x188);
              auVar100._12_4_ =
                   *(float *)(uVar30 + 0x6c) * fVar76 +
                   *(float *)(uVar30 + 0xcc) * fVar9 +
                   *(float *)(uVar30 + 300) * fVar10 + *(float *)(uVar30 + 0x18c);
              auVar100._16_4_ =
                   *(float *)(uVar30 + 0x70) * fVar76 +
                   *(float *)(uVar30 + 0xd0) * fVar9 +
                   *(float *)(uVar30 + 0x130) * fVar10 + *(float *)(uVar30 + 400);
              auVar100._20_4_ =
                   *(float *)(uVar30 + 0x74) * fVar76 +
                   *(float *)(uVar30 + 0xd4) * fVar9 +
                   *(float *)(uVar30 + 0x134) * fVar10 + *(float *)(uVar30 + 0x194);
              auVar100._24_4_ =
                   *(float *)(uVar30 + 0x78) * fVar76 +
                   *(float *)(uVar30 + 0xd8) * fVar9 +
                   *(float *)(uVar30 + 0x138) * fVar10 + *(float *)(uVar30 + 0x198);
              auVar100._28_4_ =
                   fVar65 + *(float *)(uVar30 + 0xbc) + fVar86 + *(float *)(uVar30 + 0x19c);
              auVar104._0_4_ =
                   *(float *)(uVar30 + 0x80) * fVar76 +
                   local_2420 * fVar9 +
                   *(float *)(uVar30 + 0x140) * fVar10 + *(float *)(uVar30 + 0x1a0);
              auVar104._4_4_ =
                   *(float *)(uVar30 + 0x84) * fVar76 +
                   fStack_241c * fVar9 +
                   *(float *)(uVar30 + 0x144) * fVar10 + *(float *)(uVar30 + 0x1a4);
              auVar104._8_4_ =
                   *(float *)(uVar30 + 0x88) * fVar76 +
                   fStack_2418 * fVar9 +
                   *(float *)(uVar30 + 0x148) * fVar10 + *(float *)(uVar30 + 0x1a8);
              auVar104._12_4_ =
                   *(float *)(uVar30 + 0x8c) * fVar76 +
                   fStack_2414 * fVar9 +
                   *(float *)(uVar30 + 0x14c) * fVar10 + *(float *)(uVar30 + 0x1ac);
              auVar104._16_4_ =
                   *(float *)(uVar30 + 0x90) * fVar76 +
                   fStack_2410 * fVar9 +
                   *(float *)(uVar30 + 0x150) * fVar10 + *(float *)(uVar30 + 0x1b0);
              auVar104._20_4_ =
                   *(float *)(uVar30 + 0x94) * fVar76 +
                   fStack_240c * fVar9 +
                   *(float *)(uVar30 + 0x154) * fVar10 + *(float *)(uVar30 + 0x1b4);
              auVar104._24_4_ =
                   *(float *)(uVar30 + 0x98) * fVar76 +
                   fStack_2408 * fVar9 +
                   *(float *)(uVar30 + 0x158) * fVar10 + *(float *)(uVar30 + 0x1b8);
              auVar104._28_4_ = fVar65 + fVar92;
              auVar109 = vsubps_avx(_local_2620,auVar96);
              auVar28._4_4_ = fStack_23bc;
              auVar28._0_4_ = local_23c0;
              auVar28._8_4_ = fStack_23b8;
              auVar28._12_4_ = fStack_23b4;
              auVar28._16_4_ = fStack_23b0;
              auVar28._20_4_ = fStack_23ac;
              auVar28._24_4_ = fStack_23a8;
              auVar28._28_4_ = fVar127 + fVar10;
              auVar8 = vsubps_avx(auVar28,auVar100);
              auVar27._4_4_ = fStack_23dc;
              auVar27._0_4_ = local_23e0;
              auVar27._8_4_ = fStack_23d8;
              auVar27._12_4_ = fStack_23d4;
              auVar27._16_4_ = fStack_23d0;
              auVar27._20_4_ = fStack_23cc;
              auVar27._24_4_ = fStack_23c8;
              auVar27._28_4_ = fVar127 + fVar6;
              auVar11 = vsubps_avx(auVar27,auVar104);
              auVar89._0_4_ = fVar105 * auVar109._0_4_;
              auVar89._4_4_ = fVar110 * auVar109._4_4_;
              auVar89._8_4_ = fVar111 * auVar109._8_4_;
              auVar89._12_4_ = fVar112 * auVar109._12_4_;
              auVar19._16_4_ = fVar113 * auVar109._16_4_;
              auVar19._0_16_ = auVar89;
              auVar19._20_4_ = fVar114 * auVar109._20_4_;
              auVar19._24_4_ = fVar115 * auVar109._24_4_;
              auVar19._28_4_ = fVar92;
              auVar79._0_4_ = auVar8._0_4_ * fVar45;
              auVar79._4_4_ = auVar8._4_4_ * fVar54;
              auVar79._8_4_ = auVar8._8_4_ * fVar55;
              auVar79._12_4_ = auVar8._12_4_ * fVar56;
              auVar20._16_4_ = auVar8._16_4_ * fVar57;
              auVar20._0_16_ = auVar79;
              auVar20._20_4_ = auVar8._20_4_ * fVar58;
              auVar20._24_4_ = auVar8._24_4_ * fVar59;
              auVar20._28_4_ = auVar8._28_4_;
              auVar60._0_4_ = auVar11._0_4_ * fVar116;
              auVar60._4_4_ = auVar11._4_4_ * fVar118;
              auVar60._8_4_ = auVar11._8_4_ * fVar119;
              auVar60._12_4_ = auVar11._12_4_ * fVar120;
              auVar21._16_4_ = auVar11._16_4_ * fVar121;
              auVar21._0_16_ = auVar60;
              auVar21._20_4_ = auVar11._20_4_ * fVar122;
              auVar21._24_4_ = auVar11._24_4_ * fVar123;
              auVar21._28_4_ = auVar109._28_4_;
              auVar109 = vsubps_avx(auVar128,auVar96);
              auVar26._4_4_ = fStack_243c;
              auVar26._0_4_ = local_2440;
              auVar26._8_4_ = fStack_2438;
              auVar26._12_4_ = fStack_2434;
              auVar26._16_4_ = fStack_2430;
              auVar26._20_4_ = fStack_242c;
              auVar26._24_4_ = fStack_2428;
              auVar26._28_4_ = fStack_2424;
              auVar8 = vsubps_avx(auVar26,auVar100);
              auVar11 = vsubps_avx(auVar131,auVar104);
              auVar69._0_4_ = fVar105 * auVar109._0_4_;
              auVar69._4_4_ = fVar110 * auVar109._4_4_;
              auVar69._8_4_ = fVar111 * auVar109._8_4_;
              auVar69._12_4_ = fVar112 * auVar109._12_4_;
              auVar22._16_4_ = fVar113 * auVar109._16_4_;
              auVar22._0_16_ = auVar69;
              auVar22._20_4_ = fVar114 * auVar109._20_4_;
              auVar22._24_4_ = fVar115 * auVar109._24_4_;
              auVar22._28_4_ = fStack_2424;
              auVar94._0_4_ = auVar8._0_4_ * fVar45;
              auVar94._4_4_ = auVar8._4_4_ * fVar54;
              auVar94._8_4_ = auVar8._8_4_ * fVar55;
              auVar94._12_4_ = auVar8._12_4_ * fVar56;
              auVar23._16_4_ = auVar8._16_4_ * fVar57;
              auVar23._0_16_ = auVar94;
              auVar23._20_4_ = auVar8._20_4_ * fVar58;
              auVar23._24_4_ = auVar8._24_4_ * fVar59;
              auVar23._28_4_ = auVar109._28_4_;
              auVar97 = ZEXT3264(auVar23);
              auVar48._0_4_ = auVar11._0_4_ * fVar116;
              auVar48._4_4_ = auVar11._4_4_ * fVar118;
              auVar48._8_4_ = auVar11._8_4_ * fVar119;
              auVar48._12_4_ = auVar11._12_4_ * fVar120;
              auVar8._16_4_ = auVar11._16_4_ * fVar121;
              auVar8._0_16_ = auVar48;
              auVar8._20_4_ = auVar11._20_4_ * fVar122;
              auVar8._24_4_ = auVar11._24_4_ * fVar123;
              auVar8._28_4_ = auVar53._28_4_ + auVar52._28_4_;
              auVar47 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
              auVar46 = vpminsd_avx(auVar89,auVar69);
              auVar108._16_16_ = auVar47;
              auVar108._0_16_ = auVar46;
              auVar47 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
              auVar46 = vpminsd_avx(auVar79,auVar94);
              auVar125._16_16_ = auVar47;
              auVar125._0_16_ = auVar46;
              auVar64 = auVar21._16_16_;
              in_ZMM14 = ZEXT1664(auVar64);
              auVar47 = vpminsd_avx(auVar64,auVar8._16_16_);
              auVar46 = vpminsd_avx(auVar60,auVar48);
              auVar109._16_16_ = auVar47;
              auVar109._0_16_ = auVar46;
              auVar109 = vmaxps_avx(auVar125,auVar109);
              auVar126 = ZEXT3264(local_2540);
              auVar47 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
              auVar46 = vpmaxsd_avx(auVar89,auVar69);
              auVar74._16_16_ = auVar47;
              auVar74._0_16_ = auVar46;
              auVar47 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
              auVar124 = ZEXT3264(local_2520);
              auVar117 = ZEXT3264(local_2500);
              auVar46 = vpmaxsd_avx(auVar79,auVar94);
              auVar84._16_16_ = auVar47;
              auVar84._0_16_ = auVar46;
              auVar85 = ZEXT3264(auVar84);
              auVar47 = vpmaxsd_avx(auVar64,auVar8._16_16_);
              auVar91 = ZEXT1664(auVar47);
              auVar129 = ZEXT3264(local_2560);
              auVar46 = vpmaxsd_avx(auVar60,auVar48);
              auVar53._16_16_ = auVar47;
              auVar53._0_16_ = auVar46;
              auVar8 = vminps_avx(auVar84,auVar53);
              auVar53 = vmaxps_avx(local_2560,auVar108);
              local_2580 = vmaxps_avx(auVar53,auVar109);
              auVar63 = ZEXT3264(local_2580);
              auVar109 = vminps_avx(auVar44._0_32_,auVar74);
              auVar75 = ZEXT3264(auVar109);
              auVar109 = vminps_avx(auVar109,auVar8);
              auVar109 = vcmpps_avx(local_2580,auVar109,2);
              uVar43 = vmovmskps_avx(auVar109);
              unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar43);
            }
            else {
              auVar47 = vshufps_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),0);
              auVar51._16_16_ = auVar47;
              auVar51._0_16_ = auVar47;
              pfVar2 = (float *)(uVar30 + 0x100 + uVar37);
              fVar105 = auVar47._0_4_;
              fVar45 = auVar47._4_4_;
              fVar110 = auVar47._8_4_;
              fVar54 = auVar47._12_4_;
              pfVar1 = (float *)(uVar30 + 0x40 + uVar37);
              auVar62._0_4_ = fVar105 * *pfVar2 + *pfVar1;
              auVar62._4_4_ = fVar45 * pfVar2[1] + pfVar1[1];
              auVar62._8_4_ = fVar110 * pfVar2[2] + pfVar1[2];
              auVar62._12_4_ = fVar54 * pfVar2[3] + pfVar1[3];
              auVar62._16_4_ = fVar105 * pfVar2[4] + pfVar1[4];
              auVar62._20_4_ = fVar45 * pfVar2[5] + pfVar1[5];
              auVar62._24_4_ = fVar110 * pfVar2[6] + pfVar1[6];
              auVar62._28_4_ = auVar63._28_4_ + pfVar1[7];
              auVar109 = vsubps_avx(auVar62,auVar99);
              auVar12._4_4_ = auVar117._4_4_ * auVar109._4_4_;
              auVar12._0_4_ = auVar117._0_4_ * auVar109._0_4_;
              auVar12._8_4_ = auVar117._8_4_ * auVar109._8_4_;
              auVar12._12_4_ = auVar117._12_4_ * auVar109._12_4_;
              auVar12._16_4_ = auVar117._16_4_ * auVar109._16_4_;
              auVar12._20_4_ = auVar117._20_4_ * auVar109._20_4_;
              auVar12._24_4_ = auVar117._24_4_ * auVar109._24_4_;
              auVar12._28_4_ = auVar109._28_4_;
              pfVar2 = (float *)(uVar30 + 0x100 + uVar39);
              pfVar1 = (float *)(uVar30 + 0x40 + uVar39);
              auVar71._0_4_ = fVar105 * *pfVar2 + *pfVar1;
              auVar71._4_4_ = fVar45 * pfVar2[1] + pfVar1[1];
              auVar71._8_4_ = fVar110 * pfVar2[2] + pfVar1[2];
              auVar71._12_4_ = fVar54 * pfVar2[3] + pfVar1[3];
              auVar71._16_4_ = fVar105 * pfVar2[4] + pfVar1[4];
              auVar71._20_4_ = fVar45 * pfVar2[5] + pfVar1[5];
              auVar71._24_4_ = fVar110 * pfVar2[6] + pfVar1[6];
              auVar71._28_4_ = auVar75._28_4_ + pfVar1[7];
              auVar109 = vsubps_avx(auVar71,auVar103);
              auVar13._4_4_ = auVar124._4_4_ * auVar109._4_4_;
              auVar13._0_4_ = auVar124._0_4_ * auVar109._0_4_;
              auVar13._8_4_ = auVar124._8_4_ * auVar109._8_4_;
              auVar13._12_4_ = auVar124._12_4_ * auVar109._12_4_;
              auVar13._16_4_ = auVar124._16_4_ * auVar109._16_4_;
              auVar13._20_4_ = auVar124._20_4_ * auVar109._20_4_;
              auVar13._24_4_ = auVar124._24_4_ * auVar109._24_4_;
              auVar13._28_4_ = auVar109._28_4_;
              pfVar2 = (float *)(uVar30 + 0x100 + uVar42);
              pfVar1 = (float *)(uVar30 + 0x40 + uVar42);
              auVar81._0_4_ = fVar105 * *pfVar2 + *pfVar1;
              auVar81._4_4_ = fVar45 * pfVar2[1] + pfVar1[1];
              auVar81._8_4_ = fVar110 * pfVar2[2] + pfVar1[2];
              auVar81._12_4_ = fVar54 * pfVar2[3] + pfVar1[3];
              auVar81._16_4_ = fVar105 * pfVar2[4] + pfVar1[4];
              auVar81._20_4_ = fVar45 * pfVar2[5] + pfVar1[5];
              auVar81._24_4_ = fVar110 * pfVar2[6] + pfVar1[6];
              auVar81._28_4_ = auVar85._28_4_ + pfVar1[7];
              auVar109 = vsubps_avx(auVar81,auVar106);
              auVar14._4_4_ = auVar126._4_4_ * auVar109._4_4_;
              auVar14._0_4_ = auVar126._0_4_ * auVar109._0_4_;
              auVar14._8_4_ = auVar126._8_4_ * auVar109._8_4_;
              auVar14._12_4_ = auVar126._12_4_ * auVar109._12_4_;
              auVar14._16_4_ = auVar126._16_4_ * auVar109._16_4_;
              auVar14._20_4_ = auVar126._20_4_ * auVar109._20_4_;
              auVar14._24_4_ = auVar126._24_4_ * auVar109._24_4_;
              auVar14._28_4_ = auVar109._28_4_;
              pfVar2 = (float *)(uVar30 + 0x100 + (uVar37 ^ 0x20));
              auVar109 = vmaxps_avx(auVar13,auVar14);
              pfVar1 = (float *)(uVar30 + 0x40 + (uVar37 ^ 0x20));
              auVar82._0_4_ = fVar105 * *pfVar2 + *pfVar1;
              auVar82._4_4_ = fVar45 * pfVar2[1] + pfVar1[1];
              auVar82._8_4_ = fVar110 * pfVar2[2] + pfVar1[2];
              auVar82._12_4_ = fVar54 * pfVar2[3] + pfVar1[3];
              auVar82._16_4_ = fVar105 * pfVar2[4] + pfVar1[4];
              auVar82._20_4_ = fVar45 * pfVar2[5] + pfVar1[5];
              auVar82._24_4_ = fVar110 * pfVar2[6] + pfVar1[6];
              auVar82._28_4_ = auVar91._28_4_ + pfVar1[7];
              auVar53 = vsubps_avx(auVar82,auVar99);
              pfVar2 = (float *)(uVar30 + 0x100 + (uVar39 ^ 0x20));
              pfVar1 = (float *)(uVar30 + 0x40 + (uVar39 ^ 0x20));
              auVar90._0_4_ = fVar105 * *pfVar2 + *pfVar1;
              auVar90._4_4_ = fVar45 * pfVar2[1] + pfVar1[1];
              auVar90._8_4_ = fVar110 * pfVar2[2] + pfVar1[2];
              auVar90._12_4_ = fVar54 * pfVar2[3] + pfVar1[3];
              auVar90._16_4_ = fVar105 * pfVar2[4] + pfVar1[4];
              auVar90._20_4_ = fVar45 * pfVar2[5] + pfVar1[5];
              auVar90._24_4_ = fVar110 * pfVar2[6] + pfVar1[6];
              auVar90._28_4_ = auVar91._28_4_ + pfVar1[7];
              auVar7._4_4_ = auVar117._4_4_ * auVar53._4_4_;
              auVar7._0_4_ = auVar117._0_4_ * auVar53._0_4_;
              auVar7._8_4_ = auVar117._8_4_ * auVar53._8_4_;
              auVar7._12_4_ = auVar117._12_4_ * auVar53._12_4_;
              auVar7._16_4_ = auVar117._16_4_ * auVar53._16_4_;
              auVar7._20_4_ = auVar117._20_4_ * auVar53._20_4_;
              auVar7._24_4_ = auVar117._24_4_ * auVar53._24_4_;
              auVar7._28_4_ = auVar53._28_4_;
              auVar53 = vsubps_avx(auVar90,auVar103);
              pfVar2 = (float *)(uVar30 + 0x100 + (uVar42 ^ 0x20));
              auVar15._4_4_ = auVar124._4_4_ * auVar53._4_4_;
              auVar15._0_4_ = auVar124._0_4_ * auVar53._0_4_;
              auVar15._8_4_ = auVar124._8_4_ * auVar53._8_4_;
              auVar15._12_4_ = auVar124._12_4_ * auVar53._12_4_;
              auVar15._16_4_ = auVar124._16_4_ * auVar53._16_4_;
              auVar15._20_4_ = auVar124._20_4_ * auVar53._20_4_;
              auVar15._24_4_ = auVar124._24_4_ * auVar53._24_4_;
              auVar15._28_4_ = auVar53._28_4_;
              pfVar1 = (float *)(uVar30 + 0x40 + (uVar42 ^ 0x20));
              auVar95._0_4_ = fVar105 * *pfVar2 + *pfVar1;
              auVar95._4_4_ = fVar45 * pfVar2[1] + pfVar1[1];
              auVar95._8_4_ = fVar110 * pfVar2[2] + pfVar1[2];
              auVar95._12_4_ = fVar54 * pfVar2[3] + pfVar1[3];
              auVar95._16_4_ = fVar105 * pfVar2[4] + pfVar1[4];
              auVar95._20_4_ = fVar45 * pfVar2[5] + pfVar1[5];
              auVar95._24_4_ = fVar110 * pfVar2[6] + pfVar1[6];
              auVar95._28_4_ = auVar97._28_4_ + pfVar1[7];
              auVar53 = vsubps_avx(auVar95,auVar106);
              auVar16._4_4_ = auVar126._4_4_ * auVar53._4_4_;
              auVar16._0_4_ = auVar126._0_4_ * auVar53._0_4_;
              auVar16._8_4_ = auVar126._8_4_ * auVar53._8_4_;
              auVar16._12_4_ = auVar126._12_4_ * auVar53._12_4_;
              auVar16._16_4_ = auVar126._16_4_ * auVar53._16_4_;
              auVar16._20_4_ = auVar126._20_4_ * auVar53._20_4_;
              auVar16._24_4_ = auVar126._24_4_ * auVar53._24_4_;
              auVar16._28_4_ = auVar53._28_4_;
              auVar97 = ZEXT3264(auVar16);
              auVar8 = vminps_avx(auVar15,auVar16);
              auVar91 = ZEXT3264(auVar8);
              auVar53 = vmaxps_avx(auVar129._0_32_,auVar12);
              local_2580 = vmaxps_avx(auVar53,auVar109);
              auVar63 = ZEXT3264(local_2580);
              auVar109 = vminps_avx(auVar44._0_32_,auVar7);
              auVar109 = vminps_avx(auVar109,auVar8);
              auVar109 = vcmpps_avx(local_2580,auVar109,2);
              auVar75 = ZEXT3264(auVar109);
              if (uVar33 == 6) {
                auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar30 + 0x1c0),auVar51,2);
                auVar53 = vcmpps_avx(auVar51,*(undefined1 (*) [32])(uVar30 + 0x1e0),1);
                auVar53 = vandps_avx(auVar7,auVar53);
                auVar109 = vandps_avx(auVar53,auVar109);
                auVar75 = ZEXT1664(auVar109._16_16_);
                auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              }
              else {
                auVar47 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              }
              auVar85 = ZEXT3264(auVar7);
              auVar47 = vpsllw_avx(auVar47,0xf);
              auVar47 = vpacksswb_avx(auVar47,auVar47);
              unaff_R14 = (ulong)(byte)(SUB161(auVar47 >> 7,0) & 1 |
                                        (SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                        (SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                        (SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                        (SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                        (SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                        (SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                       SUB161(auVar47 >> 0x3f,0) << 7);
            }
          }
          if ((uVar31 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar29 = 4;
            }
            else {
              uVar30 = uVar31 & 0xfffffffffffffff0;
              lVar32 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              iVar29 = 0;
              uVar31 = *(ulong *)(uVar30 + lVar32 * 8);
              uVar38 = unaff_R14 - 1 & unaff_R14;
              if (uVar38 != 0) {
                uVar33 = *(uint *)(local_2580 + lVar32 * 4);
                lVar32 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                uVar5 = *(ulong *)(uVar30 + lVar32 * 8);
                uVar4 = *(uint *)(local_2580 + lVar32 * 4);
                uVar38 = uVar38 - 1 & uVar38;
                if (uVar38 == 0) {
                  if (uVar33 < uVar4) {
                    *(ulong *)*pauVar40 = uVar5;
                    *(uint *)(*pauVar40 + 8) = uVar4;
                    pauVar40 = pauVar40 + 1;
                  }
                  else {
                    *(ulong *)*pauVar40 = uVar31;
                    *(uint *)(*pauVar40 + 8) = uVar33;
                    uVar31 = uVar5;
                    pauVar40 = pauVar40 + 1;
                  }
                }
                else {
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar31;
                  auVar47 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar33));
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar5;
                  auVar46 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar4));
                  lVar32 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                    }
                  }
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = *(ulong *)(uVar30 + lVar32 * 8);
                  auVar64 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_2580 + lVar32 * 4)));
                  uVar38 = uVar38 - 1 & uVar38;
                  if (uVar38 == 0) {
                    auVar66 = vpcmpgtd_avx(auVar46,auVar47);
                    auVar93 = vpshufd_avx(auVar66,0xaa);
                    auVar66 = vblendvps_avx(auVar46,auVar47,auVar93);
                    auVar47 = vblendvps_avx(auVar47,auVar46,auVar93);
                    auVar46 = vpcmpgtd_avx(auVar64,auVar66);
                    auVar93 = vpshufd_avx(auVar46,0xaa);
                    auVar46 = vblendvps_avx(auVar64,auVar66,auVar93);
                    auVar85 = ZEXT1664(auVar46);
                    auVar64 = vblendvps_avx(auVar66,auVar64,auVar93);
                    auVar63 = ZEXT1664(auVar64);
                    auVar66 = vpcmpgtd_avx(auVar64,auVar47);
                    auVar93 = vpshufd_avx(auVar66,0xaa);
                    auVar75 = ZEXT1664(auVar93);
                    auVar66 = vblendvps_avx(auVar64,auVar47,auVar93);
                    auVar91 = ZEXT1664(auVar66);
                    auVar47 = vblendvps_avx(auVar47,auVar64,auVar93);
                    *pauVar40 = auVar47;
                    pauVar40[1] = auVar66;
                    uVar31 = auVar46._0_8_;
                    pauVar40 = pauVar40 + 2;
                  }
                  else {
                    lVar32 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                    auVar91 = ZEXT464(*(uint *)(local_2580 + lVar32 * 4));
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = *(ulong *)(uVar30 + lVar32 * 8);
                    auVar66 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_2580 + lVar32 * 4)));
                    uVar38 = uVar38 - 1 & uVar38;
                    if (uVar38 == 0) {
                      auVar93 = vpcmpgtd_avx(auVar46,auVar47);
                      auVar87 = vpshufd_avx(auVar93,0xaa);
                      auVar93 = vblendvps_avx(auVar46,auVar47,auVar87);
                      auVar47 = vblendvps_avx(auVar47,auVar46,auVar87);
                      auVar46 = vpcmpgtd_avx(auVar66,auVar64);
                      auVar87 = vpshufd_avx(auVar46,0xaa);
                      auVar46 = vblendvps_avx(auVar66,auVar64,auVar87);
                      auVar64 = vblendvps_avx(auVar64,auVar66,auVar87);
                      auVar66 = vpcmpgtd_avx(auVar64,auVar47);
                      auVar87 = vpshufd_avx(auVar66,0xaa);
                      auVar66 = vblendvps_avx(auVar64,auVar47,auVar87);
                      auVar47 = vblendvps_avx(auVar47,auVar64,auVar87);
                      auVar64 = vpcmpgtd_avx(auVar46,auVar93);
                      auVar87 = vpshufd_avx(auVar64,0xaa);
                      auVar64 = vblendvps_avx(auVar46,auVar93,auVar87);
                      auVar46 = vblendvps_avx(auVar93,auVar46,auVar87);
                      auVar93 = vpcmpgtd_avx(auVar66,auVar46);
                      auVar87 = vpshufd_avx(auVar93,0xaa);
                      auVar91 = ZEXT1664(auVar87);
                      auVar93 = vblendvps_avx(auVar66,auVar46,auVar87);
                      auVar97 = ZEXT1664(auVar93);
                      auVar46 = vblendvps_avx(auVar46,auVar66,auVar87);
                      auVar63 = ZEXT1664(auVar46);
                      *pauVar40 = auVar47;
                      pauVar40[1] = auVar46;
                      pauVar40[2] = auVar93;
                      uVar31 = auVar64._0_8_;
                      pauVar41 = pauVar40 + 3;
                    }
                    else {
                      *pauVar40 = auVar47;
                      pauVar40[1] = auVar46;
                      pauVar40[2] = auVar64;
                      pauVar40[3] = auVar66;
                      lVar32 = 0x30;
                      do {
                        lVar35 = lVar32;
                        lVar32 = 0;
                        if (uVar38 != 0) {
                          for (; (uVar38 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                          }
                        }
                        auVar63 = ZEXT464(*(uint *)(local_2580 + lVar32 * 4));
                        auVar50._8_8_ = 0;
                        auVar50._0_8_ = *(ulong *)(uVar30 + lVar32 * 8);
                        auVar47 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_2580 + lVar32 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar40[1] + lVar35) = auVar47;
                        uVar38 = uVar38 & uVar38 - 1;
                        lVar32 = lVar35 + 0x10;
                      } while (uVar38 != 0);
                      pauVar41 = (undefined1 (*) [16])(pauVar40[1] + lVar35);
                      if (lVar35 + 0x10 != 0) {
                        lVar32 = 0x10;
                        pauVar34 = pauVar40;
                        do {
                          uVar24 = *(undefined8 *)pauVar34[1];
                          uVar25 = *(undefined8 *)(pauVar34[1] + 8);
                          uVar33 = *(uint *)(pauVar34[1] + 8);
                          pauVar34 = pauVar34 + 1;
                          lVar35 = lVar32;
                          do {
                            if (uVar33 <= *(uint *)(pauVar40[-1] + lVar35 + 8)) {
                              pauVar36 = (undefined1 (*) [16])(*pauVar40 + lVar35);
                              break;
                            }
                            auVar63 = ZEXT1664(*(undefined1 (*) [16])(pauVar40[-1] + lVar35));
                            *(undefined1 (*) [16])(*pauVar40 + lVar35) =
                                 *(undefined1 (*) [16])(pauVar40[-1] + lVar35);
                            lVar35 = lVar35 + -0x10;
                            pauVar36 = pauVar40;
                          } while (lVar35 != 0);
                          *(undefined8 *)*pauVar36 = uVar24;
                          *(undefined8 *)(*pauVar36 + 8) = uVar25;
                          lVar32 = lVar32 + 0x10;
                        } while (pauVar41 != pauVar34);
                      }
                      uVar31 = *(ulong *)*pauVar41;
                    }
                    auVar85 = ZEXT1664(auVar66);
                    auVar75 = ZEXT1664(auVar64);
                    auVar117 = ZEXT3264(local_2500);
                    auVar124 = ZEXT3264(local_2520);
                    auVar126 = ZEXT3264(local_2540);
                    auVar129 = ZEXT3264(local_2560);
                    pauVar40 = pauVar41;
                    iVar29 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
        if (iVar29 == 6) {
          auVar75 = ZEXT1664(auVar75._0_16_);
          auVar85 = ZEXT1664(auVar85._0_16_);
          auVar91 = ZEXT1664(auVar91._0_16_);
          auVar97 = ZEXT1664(auVar97._0_16_);
          in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar31 & 0xfffffffffffffff0) * 0x40))(local_24e0,ray,context)
          ;
          auVar129 = ZEXT3264(local_2560);
          auVar126 = ZEXT3264(local_2540);
          auVar124 = ZEXT3264(local_2520);
          auVar117 = ZEXT3264(local_2500);
          fVar105 = (ray->super_RayK<1>).tfar;
          auVar44 = ZEXT3264(CONCAT428(fVar105,CONCAT424(fVar105,CONCAT420(fVar105,CONCAT416(fVar105
                                                  ,CONCAT412(fVar105,CONCAT48(fVar105,CONCAT44(
                                                  fVar105,fVar105))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }